

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void dispatch_timed_event(tgestate_t *state)

{
  eventtime_t eVar1;
  timedevent_handler_t **pptVar2;
  char cVar3;
  
  eVar1 = state->clock + '\x01';
  if (eVar1 == 0x8c) {
    eVar1 = '\0';
  }
  state->clock = eVar1;
  pptVar2 = &dispatch_timed_event::timed_events[0].handler;
  cVar3 = -0xf;
  do {
    if (eVar1 == ((timedevent_t *)(pptVar2 + -1))->time) {
      (**pptVar2)(state);
      return;
    }
    pptVar2 = pptVar2 + 2;
    cVar3 = cVar3 + '\x01';
  } while (cVar3 != '\0');
  return;
}

Assistant:

void dispatch_timed_event(tgestate_t *state)
{
  /**
   * $A173: Timed events.
   */
  static const timedevent_t timed_events[15] =
  {
    {   0, &event_another_day_dawns    },
    {   8, &event_wake_up              },
    {  12, &event_new_red_cross_parcel },
    {  16, &event_go_to_roll_call      },
    {  20, &event_roll_call            },
    {  21, &event_go_to_breakfast_time },
    {  36, &event_end_of_breakfast     },
    {  46, &event_go_to_exercise_time  },
    {  64, &event_exercise_time        },
    {  74, &event_go_to_roll_call      },
    {  78, &event_roll_call            },
    {  79, &event_go_to_time_for_bed   },
    {  98, &event_time_for_bed         },
    { 100, &event_night_time           },
    { 130, &event_search_light         },
  };

  eventtime_t        *pcounter; /* was HL */
  eventtime_t         time;     /* was A */
  const timedevent_t *event;    /* was HL */
  uint8_t             iters;    /* was B */

  assert(state != NULL);

  /* Increment the clock, wrapping at 140. */
  pcounter = &state->clock;
  time = *pcounter + 1;
  if (time == 140) // hoist 140 out to time_MAX or somesuch
    time = 0;
  *pcounter = time;

  /* Dispatch the event for that time. */
  event = &timed_events[0];
  iters = NELEMS(timed_events);
  do
  {
    if (time == event->time)
      goto found; // in future rewrite to avoid the goto
    event++;
  }
  while (--iters);

  return;

found:
  event->handler(state);
}